

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O2

unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
 __thiscall
spvtools::opt::CopyPropagateArrays::BuildMemoryObjectFromCompositeConstruct
          (CopyPropagateArrays *this,Instruction *conststruct_inst)

{
  long lVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  Instruction *in_RDX;
  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
  memory_object;
  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
  member_object;
  AccessChainEntry last_access;
  
  if (in_RDX->opcode_ != OpCompositeConstruct) {
    __assert_fail("conststruct_inst->opcode() == spv::Op::OpCompositeConstruct && \"Expecting an OpCompositeConstruct instruction.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                  ,0x15d,
                  "std::unique_ptr<CopyPropagateArrays::MemoryObject> spvtools::opt::CopyPropagateArrays::BuildMemoryObjectFromCompositeConstruct(Instruction *)"
                 );
  }
  Instruction::GetSingleWordInOperand(in_RDX,0);
  GetSourceObjectIfAny((CopyPropagateArrays *)&memory_object,(uint32_t)conststruct_inst);
  if (((__uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
        )memory_object._M_t.
         super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
         .super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>.
         _M_head_impl !=
       (__uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
        )0x0) &&
     (*(long *)((long)memory_object._M_t.
                      super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                      .
                      super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                      ._M_head_impl + 8) !=
      *(long *)((long)memory_object._M_t.
                      super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                      .
                      super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                      ._M_head_impl + 0x10))) {
    last_access = *(AccessChainEntry *)
                   (*(long *)((long)memory_object._M_t.
                                    super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                    .
                                    super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                                    ._M_head_impl + 0x10) + -8);
    bVar2 = IsAccessChainIndexValidAndEqualTo
                      ((CopyPropagateArrays *)conststruct_inst,&last_access,0);
    if (bVar2) {
      MemoryObject::PopIndirection
                ((MemoryObject *)
                 memory_object._M_t.
                 super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                 .super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>.
                 _M_head_impl);
      uVar3 = MemoryObject::GetNumberOfMembers
                        ((MemoryObject *)
                         memory_object._M_t.
                         super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                         .
                         super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                         ._M_head_impl);
      uVar4 = Instruction::NumInOperands(in_RDX);
      if (uVar3 == uVar4) {
        uVar3 = 1;
        while( true ) {
          uVar4 = Instruction::NumInOperands(in_RDX);
          if (uVar4 <= uVar3) break;
          Instruction::GetSingleWordInOperand(in_RDX,uVar3);
          GetSourceObjectIfAny((CopyPropagateArrays *)&member_object,(uint32_t)conststruct_inst);
          if (((__uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                )member_object._M_t.
                 super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                 .super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>.
                 _M_head_impl ==
               (__uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                )0x0) ||
             (lVar1 = *(long *)((long)member_object._M_t.
                                      super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                                      .
                                      super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                                      ._M_head_impl + 0x10),
             *(long *)((long)member_object._M_t.
                             super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                             .
                             super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                             ._M_head_impl + 8) == lVar1)) {
LAB_004d01cc:
            (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)0x0;
            std::
            unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
            ::~unique_ptr(&member_object);
            goto LAB_004d01b2;
          }
          bVar2 = MemoryObject::Contains
                            ((MemoryObject *)
                             memory_object._M_t.
                             super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                             .
                             super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                             ._M_head_impl,
                             (MemoryObject *)
                             member_object._M_t.
                             super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                             .
                             super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                             ._M_head_impl);
          if (!bVar2) goto LAB_004d01cc;
          last_access = *(AccessChainEntry *)(lVar1 + -8);
          bVar2 = IsAccessChainIndexValidAndEqualTo
                            ((CopyPropagateArrays *)conststruct_inst,&last_access,uVar3);
          if (!bVar2) goto LAB_004d01cc;
          std::
          unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
          ::~unique_ptr(&member_object);
          uVar3 = uVar3 + 1;
        }
        (this->super_MemPass).super_Pass._vptr_Pass =
             (_func_int **)
             memory_object._M_t.
             super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
             .super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>.
             _M_head_impl;
        memory_object._M_t.
        super___uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
        .super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>.
        _M_head_impl = (__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
                        )(__uniq_ptr_impl<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                          )0x0;
        goto LAB_004d01b2;
      }
    }
  }
  (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)0x0;
LAB_004d01b2:
  std::
  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
  ::~unique_ptr(&memory_object);
  return (__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<CopyPropagateArrays::MemoryObject>
CopyPropagateArrays::BuildMemoryObjectFromCompositeConstruct(
    Instruction* conststruct_inst) {
  assert(conststruct_inst->opcode() == spv::Op::OpCompositeConstruct &&
         "Expecting an OpCompositeConstruct instruction.");

  // If every operand in the instruction are part of the same memory object, and
  // are being combined in the same order, then the result is the same as the
  // parent.

  std::unique_ptr<MemoryObject> memory_object =
      GetSourceObjectIfAny(conststruct_inst->GetSingleWordInOperand(0));

  if (!memory_object) {
    return nullptr;
  }

  if (!memory_object->IsMember()) {
    return nullptr;
  }

  AccessChainEntry last_access = memory_object->AccessChain().back();
  if (!IsAccessChainIndexValidAndEqualTo(last_access, 0)) {
    return nullptr;
  }

  memory_object->PopIndirection();
  if (memory_object->GetNumberOfMembers() !=
      conststruct_inst->NumInOperands()) {
    return nullptr;
  }

  for (uint32_t i = 1; i < conststruct_inst->NumInOperands(); ++i) {
    std::unique_ptr<MemoryObject> member_object =
        GetSourceObjectIfAny(conststruct_inst->GetSingleWordInOperand(i));

    if (!member_object) {
      return nullptr;
    }

    if (!member_object->IsMember()) {
      return nullptr;
    }

    if (!memory_object->Contains(member_object.get())) {
      return nullptr;
    }

    last_access = member_object->AccessChain().back();
    if (!IsAccessChainIndexValidAndEqualTo(last_access, i)) {
      return nullptr;
    }
  }
  return memory_object;
}